

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::FinalizeBindOrderExpression
          (duckdb *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          idx_t table_index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *sql_types,SelectBindState *bind_state)

{
  LogicalTypeId LVar1;
  pointer pEVar2;
  BoundConstantExpression *pBVar3;
  uint64_t uVar4;
  idx_t index;
  vector<duckdb::Value,_true> *this_00;
  const_reference pvVar5;
  const_reference pvVar6;
  InternalException *pIVar7;
  BinderException *this_01;
  type expr_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_02;
  allocator local_a9;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_a8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_a0;
  string collation;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_78;
  string local_70;
  string local_50;
  
  local_a8._M_head_impl = (Expression *)this;
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  pBVar3 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&pEVar2->super_BaseExpression);
  LVar1 = (pBVar3->value).type_.id_;
  if (LVar1 == VARCHAR) {
    ((local_a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression = (_func_int **)0x0;
    this_02._M_head_impl = local_a8._M_head_impl;
  }
  else if (LVar1 == STRUCT) {
    this_00 = StructValue::GetChildren(&pBVar3->value);
    if (0x80 < (ulong)((long)(this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
      pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&collation,"Expected one or two children: index and optional collation",
                 (allocator *)&local_70);
      InternalException::InternalException(pIVar7,&collation);
      __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
    uVar4 = UBigIntValue::Get(pvVar5);
    collation._M_dataplus._M_p = (pointer)&collation.field_2;
    collation._M_string_length = 0;
    collation.field_2._M_local_buf[0] = '\0';
    if ((long)(this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start == 0x80) {
      pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,1);
      StringValue::Get_abi_cxx11_(pvVar5);
      ::std::__cxx11::string::_M_assign((string *)&collation);
    }
    this_02._M_head_impl = local_a8._M_head_impl;
    local_a0._M_head_impl =
         (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
         .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    CreateOrderExpression
              ((duckdb *)local_a8._M_head_impl,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_a0,names,sql_types,table_index,uVar4);
    if (local_a0._M_head_impl != (Expression *)0x0) {
      (*((local_a0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_a0._M_head_impl = (Expression *)0x0;
    if (collation._M_string_length != 0) {
      pvVar6 = vector<duckdb::LogicalType,_true>::get<true>(sql_types,uVar4);
      if (pvVar6->id_ != VARCHAR) {
        this_01 = (BinderException *)__cxa_allocate_exception(0x10);
        expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)this_02._M_head_impl);
        ::std::__cxx11::string::string
                  ((string *)&local_70,"COLLATE can only be applied to varchar columns",&local_a9);
        BinderException::BinderException<>(this_01,expr_00,&local_70);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)collation._M_dataplus._M_p == &collation.field_2) {
        local_50.field_2._8_8_ = collation.field_2._8_8_;
      }
      else {
        local_50._M_dataplus._M_p = collation._M_dataplus._M_p;
      }
      local_50.field_2._M_allocated_capacity._1_7_ = collation.field_2._M_allocated_capacity._1_7_;
      local_50.field_2._M_local_buf[0] = collation.field_2._M_local_buf[0];
      local_50._M_string_length = collation._M_string_length;
      collation._M_string_length = 0;
      collation.field_2._M_local_buf[0] = '\0';
      collation._M_dataplus._M_p = (pointer)&collation.field_2;
      LogicalType::VARCHAR_COLLATION((LogicalType *)&local_70,&local_50);
      pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)this_02._M_head_impl);
      LogicalType::operator=(&pEVar2->return_type,(LogicalType *)&local_70);
      LogicalType::~LogicalType((LogicalType *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    ::std::__cxx11::string::~string((string *)&collation);
  }
  else {
    if (LVar1 != UBIGINT) {
      pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&collation,"Unknown type in FinalizeBindOrderExpression",
                 (allocator *)&local_70);
      InternalException::InternalException(pIVar7,&collation);
      __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar4 = UBigIntValue::Get(&pBVar3->value);
    local_78._M_head_impl =
         (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
         .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    index = SelectBindState::GetFinalIndex(bind_state,uVar4);
    this_02._M_head_impl = local_a8._M_head_impl;
    CreateOrderExpression
              ((duckdb *)local_a8._M_head_impl,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_78,names,sql_types,table_index,index);
    if (local_78._M_head_impl != (Expression *)0x0) {
      (*((local_78._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         this_02._M_head_impl;
}

Assistant:

unique_ptr<Expression> FinalizeBindOrderExpression(unique_ptr<Expression> expr, idx_t table_index,
                                                   const vector<string> &names, const vector<LogicalType> &sql_types,
                                                   const SelectBindState &bind_state) {
	auto &constant = expr->Cast<BoundConstantExpression>();
	switch (constant.value.type().id()) {
	case LogicalTypeId::UBIGINT: {
		// index
		auto index = UBigIntValue::Get(constant.value);
		return CreateOrderExpression(std::move(expr), names, sql_types, table_index, bind_state.GetFinalIndex(index));
	}
	case LogicalTypeId::VARCHAR: {
		// ORDER BY ALL
		return nullptr;
	}
	case LogicalTypeId::STRUCT: {
		// collation
		auto &struct_values = StructValue::GetChildren(constant.value);
		if (struct_values.size() > 2) {
			throw InternalException("Expected one or two children: index and optional collation");
		}
		auto index = UBigIntValue::Get(struct_values[0]);
		string collation;
		if (struct_values.size() == 2) {
			collation = StringValue::Get(struct_values[1]);
		}
		auto result = CreateOrderExpression(std::move(expr), names, sql_types, table_index, index);
		if (!collation.empty()) {
			if (sql_types[index].id() != LogicalTypeId::VARCHAR) {
				throw BinderException(*result, "COLLATE can only be applied to varchar columns");
			}
			result->return_type = LogicalType::VARCHAR_COLLATION(std::move(collation));
		}
		return result;
	}
	default:
		throw InternalException("Unknown type in FinalizeBindOrderExpression");
	}
}